

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

void __thiscall
HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
          (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *this)

{
  uchar *puVar1;
  _Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false> _Var2;
  pointer *__ptr;
  
  puVar1 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  (this->metadata)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  _Var2._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
       .
       super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl != (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)0x0) {
    operator_delete(_Var2._M_head_impl);
  }
  (this->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>.
  _M_head_impl = (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)0x0;
  return;
}

Assistant:

~HighsHashTable() {
    if (!std::is_trivially_destructible<Entry>::value && metadata) {
      u64 capacity = tableSizeMask + 1;
      for (u64 i = 0; i < capacity; ++i) {
        if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
    }
  }